

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.cc
# Opt level: O1

string * __thiscall
upb::generator::StripExtension_abi_cxx11_
          (string *__return_storage_ptr__,generator *this,string_view fname)

{
  generator *pgVar1;
  generator *pgVar2;
  generator *pgVar3;
  size_t sVar4;
  
  sVar4 = fname._M_len;
  pgVar2 = this;
  if (this == (generator *)0x0) {
LAB_002ee726:
    pgVar3 = (generator *)0xffffffffffffffff;
  }
  else {
    do {
      pgVar3 = pgVar2 + -1;
      if (pgVar2 == (generator *)0x0) goto LAB_002ee726;
      pgVar1 = pgVar2 + (sVar4 - 1);
      pgVar2 = pgVar3;
    } while (*pgVar1 != (generator)0x2e);
  }
  pgVar2 = pgVar3;
  if (this < pgVar3) {
    pgVar2 = this;
  }
  if (pgVar3 == (generator *)0xffffffffffffffff) {
    pgVar2 = this;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,sVar4,pgVar2 + sVar4);
  return __return_storage_ptr__;
}

Assistant:

std::string StripExtension(absl::string_view fname) {
  size_t lastdot = fname.find_last_of('.');
  if (lastdot == std::string::npos) {
    return std::string(fname);
  }
  return std::string(fname.substr(0, lastdot));
}